

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::BindingRenderCase::iterate(BindingRenderCase *this)

{
  ostringstream *poVar1;
  uint uVar2;
  TestLog *this_00;
  bool bVar3;
  int y;
  int iVar4;
  size_t __n;
  Surface *pSVar5;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  int x;
  int iVar6;
  qpTestResult testResult;
  char *pcVar7;
  undefined4 uVar8;
  bool bVar9;
  bool bVar10;
  allocator<char> local_366;
  allocator<char> local_365;
  allocator<char> local_364;
  allocator<char> local_363;
  allocator<char> local_362;
  allocator<char> local_361;
  Surface surface;
  Surface error;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  LogImageSet local_270;
  LogImage local_230;
  MessageBuilder local_1a0;
  
  tcu::Surface::Surface(&surface,0x40,0x40);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,&surface);
  this_00 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::Surface::Surface(&error,surface.m_width,surface.m_height);
  poVar1 = &local_1a0.m_str;
  local_1a0.m_log = this_00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Verifying image contents.");
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  bVar3 = true;
  __n = 0xff00ff00;
  for (iVar4 = 0; iVar4 < surface.m_height; iVar4 = iVar4 + 1) {
    for (iVar6 = 0; iVar6 < surface.m_width; iVar6 = iVar6 + 1) {
      uVar2 = *(uint *)((long)surface.m_pixels.m_ptr + (long)(surface.m_width * iVar4 + iVar6) * 4);
      bVar9 = (~(uVar2 >> 8) & 0xff) < 0x15;
      bVar10 = (uVar2 & 0xff0000) < 0x140001;
      uVar8 = 0xff0000ff;
      if (bVar10 && bVar9) {
        uVar8 = 0xff00ff00;
      }
      *(undefined4 *)((long)error.m_pixels.m_ptr + (long)(error.m_width * iVar4 + iVar6) * 4) =
           uVar8;
      bVar3 = (bool)(bVar3 & (bVar10 && bVar9));
    }
  }
  poVar1 = &local_1a0.m_str;
  if (bVar3) {
    local_1a0.m_log = this_00;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Image verification passed.");
    tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  else {
    local_1a0.m_log = this_00;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Image verification failed.");
    tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"Verfication result",&local_361);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"Result of rendering",&local_362);
    tcu::LogImageSet::LogImageSet(&local_270,&local_290,&local_2b0);
    iVar4 = (int)this_00;
    tcu::LogImageSet::write(&local_270,iVar4,__buf,__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Result",&local_363);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"Result",&local_364);
    pSVar5 = &surface;
    tcu::LogImage::LogImage
              ((LogImage *)&local_1a0,&local_2d0,&local_2f0,pSVar5,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&local_1a0,iVar4,__buf_00,(size_t)pSVar5);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"ErrorMask",&local_365);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"Error mask",&local_366)
    ;
    pSVar5 = &error;
    tcu::LogImage::LogImage(&local_230,&local_310,&local_330,pSVar5,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_230,iVar4,__buf_01,(size_t)pSVar5);
    tcu::TestLog::endImageSet(this_00);
    tcu::LogImage::~LogImage(&local_230);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_310);
    tcu::LogImage::~LogImage((LogImage *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2d0);
    tcu::LogImageSet::~LogImageSet(&local_270);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
  }
  tcu::Surface::~Surface(&error);
  pcVar7 = "Image verification failed";
  if ((this->m_unalignedData & 1U) != 0) {
    pcVar7 = "Failed to draw with unaligned data";
  }
  testResult = QP_TEST_RESULT_PASS;
  if (!bVar3) {
    testResult = (this->m_unalignedData & 1) * 2 + QP_TEST_RESULT_FAIL;
  }
  description = "Pass";
  if (!bVar3) {
    description = pcVar7;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  tcu::Surface::~Surface(&surface);
  return STOP;
}

Assistant:

BindingRenderCase::IterateResult BindingRenderCase::iterate (void)
{
	tcu::Surface surface(TEST_RENDER_SIZE, TEST_RENDER_SIZE);

	// draw pattern

	renderTo(surface);

	// verify results

	if (verifyImageYellowGreen(surface, m_testCtx.getLog(), false))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else if (m_unalignedData)
		m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned data");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

	return STOP;
}